

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint32 scopeIndex,CacheId cacheId)

{
  bool bVar1;
  uchar local_2b;
  uchar uStack_2a;
  uchar uStack_29;
  uint local_28;
  uint32 uStack_24;
  OpLayoutT_ElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  CacheId cacheId_local;
  uint32 scopeIndex_local;
  RegSlot value_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_28 = cacheId;
  uStack_24 = scopeIndex;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>(&local_2b,value);
  if (((bVar1) &&
      (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                         (&uStack_2a,local_28), bVar1)) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                        (&uStack_29,uStack_24), bVar1)) {
    Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,&local_2b,3,this);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ByteCodeWriter::TryWriteElementPIndexed(OpCode op, RegSlot value, uint32 scopeIndex, CacheId cacheId)
    {
        OpLayoutT_ElementPIndexed<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value)
            && SizePolicy::Assign(layout.inlineCacheIndex, cacheId)
            && SizePolicy::Assign(layout.scopeIndex, scopeIndex))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }